

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O3

void __thiscall duckdb::ExtensionFunctionInfo::~ExtensionFunctionInfo(ExtensionFunctionInfo *this)

{
  pointer pcVar1;
  
  (this->super_ScalarFunctionInfo)._vptr_ScalarFunctionInfo =
       (_func_int **)&PTR__ExtensionFunctionInfo_01966cc0;
  pcVar1 = (this->extension)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->extension).field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

explicit ExtensionFunctionInfo(string extension_p) : extension(std::move(extension_p)) {
	}